

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O2

void duckdb::udf_ternary_function<long>(DataChunk *input,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  reference pvVar4;
  idx_t i;
  ulong row_idx;
  
  duckdb::DataChunk::Flatten();
  duckdb::Vector::SetVectorType((VectorType)result);
  lVar1 = *(long *)(result + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,2);
  lVar2 = *(long *)(pvVar4 + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,2);
  FlatVector::VerifyFlatVector(pvVar4);
  FlatVector::SetValidity(result,(ValidityMask *)(pvVar4 + 0x28));
  for (row_idx = 0; row_idx < *(ulong *)(input + 0x18); row_idx = row_idx + 1) {
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)(pvVar4 + 0x28),row_idx);
    if (bVar3) {
      *(undefined8 *)(lVar1 + row_idx * 8) = *(undefined8 *)(lVar2 + row_idx * 8);
    }
  }
  return;
}

Assistant:

static void udf_ternary_function(DataChunk &input, ExpressionState &state, Vector &result) {
	input.Flatten();
	switch (GetTypeId<TYPE>()) {
	case PhysicalType::VARCHAR: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<string_t>(result);
		auto ldata = FlatVector::GetData<string_t>(input.data[2]);
		auto &validity = FlatVector::Validity(input.data[0]);

		FlatVector::SetValidity(result, FlatVector::Validity(input.data[2]));

		for (idx_t i = 0; i < input.size(); i++) {
			if (!validity.RowIsValid(i)) {
				continue;
			}
			auto input_length = ldata[i].GetSize();
			string_t target = StringVector::EmptyString(result, input_length);
			auto target_data = target.GetDataWriteable();
			memcpy(target_data, ldata[i].GetData(), input_length);
			target.Finalize();
			result_data[i] = target;
		}
		break;
	}
	default: {
		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<TYPE>(result);
		auto ldata = FlatVector::GetData<TYPE>(input.data[2]);
		auto &mask = FlatVector::Validity(input.data[2]);
		FlatVector::SetValidity(result, mask);

		for (idx_t i = 0; i < input.size(); i++) {
			if (!mask.RowIsValid(i)) {
				continue;
			}
			result_data[i] = ldata[i];
		}
	}
	}
}